

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

void * alloc_small(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  _func_void_j_common_ptr **pp_Var1;
  jpeg_memory_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  _func_void_ptr_j_common_ptr_int_size_t *p_Var4;
  bool bVar5;
  _func_void_ptr_j_common_ptr_int_size_t **pp_Var6;
  _func_void_ptr_j_common_ptr_int_size_t **pp_Var7;
  size_t *psVar8;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var9;
  _func_void_ptr_j_common_ptr_int_size_t **pp_Var10;
  ulong uVar11;
  ulong uVar12;
  
  pjVar2 = cinfo->mem;
  if (0xffe8 < sizeofobject) {
    *(undefined8 *)&cinfo->err->msg_code = 0x100000038;
    (*cinfo->err->error_exit)(cinfo);
  }
  if (1 < (uint)pool_id) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0xf;
    (pjVar3->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  p_Var9 = (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)
           (sizeofobject + 7 & 0xfffffffffffffff8);
  pp_Var7 = &pjVar2[1].alloc_small + pool_id;
  pp_Var6 = pp_Var7;
  pp_Var10 = (_func_void_ptr_j_common_ptr_int_size_t **)0x0;
  while (pp_Var6 = (_func_void_ptr_j_common_ptr_int_size_t **)*pp_Var6,
        pp_Var6 != (_func_void_ptr_j_common_ptr_int_size_t **)0x0) {
    pp_Var10 = pp_Var6;
    if (p_Var9 <= pp_Var6[2]) goto LAB_00111462;
  }
  psVar8 = extra_pool_slop;
  if (pp_Var10 == (_func_void_ptr_j_common_ptr_int_size_t **)0x0) {
    psVar8 = first_pool_slop;
  }
  uVar11 = 0xffe8U - (long)p_Var9;
  if (psVar8[pool_id] < 0xffe8U - (long)p_Var9) {
    uVar11 = psVar8[pool_id];
  }
  while( true ) {
    pp_Var6 = (_func_void_ptr_j_common_ptr_int_size_t **)
              jpeg_get_small(cinfo,(size_t)(p_Var9 + uVar11 + 0x18));
    if (pp_Var6 != (_func_void_ptr_j_common_ptr_int_size_t **)0x0) break;
    uVar12 = uVar11 >> 1;
    bVar5 = uVar11 < 100;
    uVar11 = uVar12;
    if (bVar5) {
      *(undefined8 *)&cinfo->err->msg_code = 0x200000038;
      (*cinfo->err->error_exit)(cinfo);
    }
  }
  pp_Var1 = &pjVar2[1].realize_virt_arrays;
  *pp_Var1 = *pp_Var1 + (long)(p_Var9 + uVar11 + 0x18);
  *pp_Var6 = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
  pp_Var6[1] = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
  pp_Var6[2] = (_func_void_ptr_j_common_ptr_int_size_t *)(p_Var9 + uVar11);
  if (pp_Var10 != (_func_void_ptr_j_common_ptr_int_size_t **)0x0) {
    pp_Var7 = pp_Var10;
  }
  *pp_Var7 = (_func_void_ptr_j_common_ptr_int_size_t *)pp_Var6;
LAB_00111462:
  p_Var4 = pp_Var6[1];
  pp_Var6[1] = p_Var4 + (long)p_Var9;
  pp_Var6[2] = pp_Var6[2] + -(long)p_Var9;
  return (_func_void_ptr_j_common_ptr_int_size_t *)((long)pp_Var6 + (long)(p_Var4 + 0x18));
}

Assistant:

METHODDEF(void *)
alloc_small (j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "small" object */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  small_pool_ptr hdr_ptr, prev_hdr_ptr;
  char * data_ptr;
  size_t odd_bytes, min_request, slop;

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if (sizeofobject > (size_t) (MAX_ALLOC_CHUNK-SIZEOF(small_pool_hdr)))
    out_of_memory(cinfo, 1);	/* request exceeds malloc's ability */

  /* Round up the requested size to a multiple of SIZEOF(ALIGN_TYPE) */
  odd_bytes = sizeofobject % SIZEOF(ALIGN_TYPE);
  if (odd_bytes > 0)
    sizeofobject += SIZEOF(ALIGN_TYPE) - odd_bytes;

  /* See if space is available in any existing pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */
  prev_hdr_ptr = NULL;
  hdr_ptr = mem->small_list[pool_id];
  while (hdr_ptr != NULL) {
    if (hdr_ptr->hdr.bytes_left >= sizeofobject)
      break;			/* found pool with enough space */
    prev_hdr_ptr = hdr_ptr;
    hdr_ptr = hdr_ptr->hdr.next;
  }

  /* Time to make a new pool? */
  if (hdr_ptr == NULL) {
    /* min_request is what we need now, slop is what will be leftover */
    min_request = sizeofobject + SIZEOF(small_pool_hdr);
    if (prev_hdr_ptr == NULL)	/* first pool in class? */
      slop = first_pool_slop[pool_id];
    else
      slop = extra_pool_slop[pool_id];
    /* Don't ask for more than MAX_ALLOC_CHUNK */
    if (slop > (size_t) (MAX_ALLOC_CHUNK-min_request))
      slop = (size_t) (MAX_ALLOC_CHUNK-min_request);
    /* Try to get space, if fail reduce slop and try again */
    for (;;) {
      hdr_ptr = (small_pool_ptr) jpeg_get_small(cinfo, min_request + slop);
      if (hdr_ptr != NULL)
	break;
      slop /= 2;
      if (slop < MIN_SLOP)	/* give up when it gets real small */
	out_of_memory(cinfo, 2); /* jpeg_get_small failed */
    }
    mem->total_space_allocated += min_request + slop;
    /* Success, initialize the new pool header and add to end of list */
    hdr_ptr->hdr.next = NULL;
    hdr_ptr->hdr.bytes_used = 0;
    hdr_ptr->hdr.bytes_left = sizeofobject + slop;
    if (prev_hdr_ptr == NULL)	/* first pool in class? */
      mem->small_list[pool_id] = hdr_ptr;
    else
      prev_hdr_ptr->hdr.next = hdr_ptr;
  }

  /* OK, allocate the object from the current pool */
  data_ptr = (char *) (hdr_ptr + 1); /* point to first data byte in pool */
  data_ptr += hdr_ptr->hdr.bytes_used; /* point to place for object */
  hdr_ptr->hdr.bytes_used += sizeofobject;
  hdr_ptr->hdr.bytes_left -= sizeofobject;

  return (void *) data_ptr;
}